

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_CCtx * ZSTD_createCCtx_advanced(ZSTD_customMem customMem)

{
  ZSTD_customMem customMem_00;
  ZSTD_customMem memManager;
  long in_stack_00000008;
  ZSTD_CCtx *cctx;
  
  if ((in_stack_00000008 == 0) == (customMem.customAlloc == (ZSTD_allocFunction)0x0)) {
    customMem_00.customFree = (ZSTD_freeFunction)customMem.customAlloc;
    customMem_00.customAlloc = (ZSTD_allocFunction)in_stack_00000008;
    customMem_00.opaque = customMem.customFree;
    cctx = (ZSTD_CCtx *)ZSTD_malloc(0x3d8,customMem_00);
    if (cctx == (ZSTD_CCtx *)0x0) {
      cctx = (ZSTD_CCtx *)0x0;
    }
    else {
      memManager.customFree = (ZSTD_freeFunction)customMem.customAlloc;
      memManager.customAlloc = (ZSTD_allocFunction)in_stack_00000008;
      unique0x10000171 = customMem._8_16_;
      ZSTD_initCCtx(cctx,memManager);
    }
  }
  else {
    cctx = (ZSTD_CCtx *)0x0;
  }
  return cctx;
}

Assistant:

ZSTD_CCtx* ZSTD_createCCtx_advanced(ZSTD_customMem customMem)
{
    ZSTD_STATIC_ASSERT(zcss_init==0);
    ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN==(0ULL - 1));
    if (!customMem.customAlloc ^ !customMem.customFree) return NULL;
    {   ZSTD_CCtx* const cctx = (ZSTD_CCtx*)ZSTD_malloc(sizeof(ZSTD_CCtx), customMem);
        if (!cctx) return NULL;
        ZSTD_initCCtx(cctx, customMem);
        return cctx;
    }
}